

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O0

void __thiscall soul::RenderingVenue::Pimpl::SessionImpl::~SessionImpl(SessionImpl *this)

{
  SessionImpl *this_local;
  
  (this->super_Session)._vptr_Session = (_func_int **)&PTR__SessionImpl_00641698;
  TaskThread::Queue::detach(&this->taskQueue);
  removeActiveSession(this->venue,this);
  std::function<void_(soul::Venue::Session::OutputEndpointActions_&,_unsigned_int)>::~function
            (&this->postRenderCallback);
  std::function<void_(soul::Venue::Session::InputEndpointActions_&,_unsigned_int)>::~function
            (&this->preRenderCallback);
  std::function<unsigned_int_(unsigned_int)>::~function(&this->getBlockSizeCallback);
  std::function<void_(unsigned_int)>::~function(&this->beginNextBlockCallback);
  std::unique_ptr<soul::Performer,_std::default_delete<soul::Performer>_>::~unique_ptr
            (&this->performer);
  TaskThread::Queue::~Queue(&this->taskQueue);
  Venue::Session::~Session(&this->super_Session);
  return;
}

Assistant:

~SessionImpl() override
        {
            taskQueue.detach();
            venue.removeActiveSession (*this);
        }